

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cpp
# Opt level: O1

string * duckdb::FileSystem::ExpandPath
                   (string *__return_storage_ptr__,string *path,
                   optional_ptr<duckdb::FileOpener,_true> opener)

{
  size_type *psVar1;
  size_type sVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  ulong uVar5;
  char *pcVar6;
  optional_ptr<duckdb::FileOpener,_true> in_stack_ffffffffffffffa8;
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  ulong *local_30;
  long local_28;
  ulong local_20 [2];
  
  sVar2 = path->_M_string_length;
  if (sVar2 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = (path->_M_dataplus)._M_p;
LAB_00e6fcd9:
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar6,pcVar6 + sVar2);
    return __return_storage_ptr__;
  }
  pcVar6 = (path->_M_dataplus)._M_p;
  if (*pcVar6 != '~') {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    goto LAB_00e6fcd9;
  }
  GetHomeDirectory_abi_cxx11_(in_stack_ffffffffffffffa8);
  ::std::__cxx11::string::substr((ulong)&local_50,(ulong)path);
  uVar5 = 0xf;
  if (local_30 != local_20) {
    uVar5 = local_20[0];
  }
  if (uVar5 < (ulong)(local_48 + local_28)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if ((ulong)(local_48 + local_28) <= uVar5) {
      puVar4 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_30);
      goto LAB_00e6fcf4;
    }
  }
  puVar4 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_30,(ulong)local_50);
LAB_00e6fcf4:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar3 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_30 == local_20) {
    return __return_storage_ptr__;
  }
  operator_delete(local_30);
  return __return_storage_ptr__;
}

Assistant:

string FileSystem::ExpandPath(const string &path, optional_ptr<FileOpener> opener) {
	if (path.empty()) {
		return path;
	}
	if (path[0] == '~') {
		return GetHomeDirectory(opener) + path.substr(1);
	}
	return path;
}